

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# phmap.h
# Opt level: O3

void __thiscall
phmap::container_internal::
raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
::drop_deletes_without_resize
          (raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned_long,_std::shared_ptr<ThreadState>_>,_phmap::Hash<unsigned_long>,_phmap::EqualTo<unsigned_long>,_std::allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_>_>
           *this)

{
  char *pcVar1;
  byte *pbVar2;
  slot_type *new_slot;
  undefined8 *puVar3;
  ulong uVar4;
  ctrl_t *pcVar5;
  slot_type *psVar6;
  unsigned_long uVar7;
  undefined1 auVar8 [16];
  char cVar9;
  char cVar10;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  undefined8 uVar24;
  element_type *peVar25;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var26;
  ctrl_t *pcVar27;
  size_t i;
  ulong uVar28;
  ulong uVar29;
  byte bVar30;
  size_t i_00;
  FindInfo FVar31;
  
  uVar4 = this->capacity_;
  if ((uVar4 == 0) || ((uVar4 + 1 & uVar4) != 0)) {
    __assert_fail("IsValidCapacity(capacity_)",
                  "/workspace/llm4binary/github/license_c_cmakelists/siemens[P]drace/vendor/greg7mdp/parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x748,
                  "void phmap::container_internal::raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned long, std::shared_ptr<ThreadState>>, phmap::Hash<uint64_t>, phmap::EqualTo<unsigned long>, std::allocator<std::pair<const unsigned long, std::shared_ptr<ThreadState>>>>::drop_deletes_without_resize() [Policy = phmap::container_internal::FlatHashMapPolicy<unsigned long, std::shared_ptr<ThreadState>>, Hash = phmap::Hash<uint64_t>, Eq = phmap::EqualTo<unsigned long>, Alloc = std::allocator<std::pair<const unsigned long, std::shared_ptr<ThreadState>>>]"
                 );
  }
  if (uVar4 < 0xf) {
    __assert_fail("!is_small()",
                  "/workspace/llm4binary/github/license_c_cmakelists/siemens[P]drace/vendor/greg7mdp/parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x749,
                  "void phmap::container_internal::raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned long, std::shared_ptr<ThreadState>>, phmap::Hash<uint64_t>, phmap::EqualTo<unsigned long>, std::allocator<std::pair<const unsigned long, std::shared_ptr<ThreadState>>>>::drop_deletes_without_resize() [Policy = phmap::container_internal::FlatHashMapPolicy<unsigned long, std::shared_ptr<ThreadState>>, Hash = phmap::Hash<uint64_t>, Eq = phmap::EqualTo<unsigned long>, Alloc = std::allocator<std::pair<const unsigned long, std::shared_ptr<ThreadState>>>]"
                 );
  }
  pcVar5 = this->ctrl_;
  if (pcVar5[uVar4] != -1) {
    __assert_fail("ctrl[capacity] == kSentinel",
                  "/workspace/llm4binary/github/license_c_cmakelists/siemens[P]drace/vendor/greg7mdp/parallel-hashmap/parallel_hashmap/phmap.h"
                  ,0x1bd,
                  "void phmap::container_internal::ConvertDeletedToEmptyAndFullToDeleted(ctrl_t *, size_t)"
                 );
  }
  pcVar27 = pcVar5 + uVar4;
  if (pcVar27 + 1 != pcVar5) {
    uVar29 = 0;
    do {
      pcVar1 = pcVar5 + uVar29;
      cVar9 = pcVar1[1];
      cVar10 = pcVar1[2];
      cVar11 = pcVar1[3];
      cVar12 = pcVar1[4];
      cVar13 = pcVar1[5];
      cVar14 = pcVar1[6];
      cVar15 = pcVar1[7];
      cVar16 = pcVar1[8];
      cVar17 = pcVar1[9];
      cVar18 = pcVar1[10];
      cVar19 = pcVar1[0xb];
      cVar20 = pcVar1[0xc];
      cVar21 = pcVar1[0xd];
      cVar22 = pcVar1[0xe];
      cVar23 = pcVar1[0xf];
      pbVar2 = (byte *)(pcVar5 + uVar29);
      *pbVar2 = -(*pcVar1 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[1] = -(cVar9 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[2] = -(cVar10 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[3] = -(cVar11 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[4] = -(cVar12 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[5] = -(cVar13 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[6] = -(cVar14 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[7] = -(cVar15 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[8] = -(cVar16 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[9] = -(cVar17 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[10] = -(cVar18 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xb] = -(cVar19 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xc] = -(cVar20 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xd] = -(cVar21 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xe] = -(cVar22 < '\0') & 0x7eU ^ 0xfe;
      pbVar2[0xf] = -(cVar23 < '\0') & 0x7eU ^ 0xfe;
      uVar29 = uVar29 + 0x10;
    } while (uVar4 + 1 != uVar29);
  }
  uVar24 = *(undefined8 *)(pcVar5 + 8);
  *(undefined8 *)(pcVar27 + 1) = *(undefined8 *)pcVar5;
  *(undefined8 *)(pcVar27 + 9) = uVar24;
  *pcVar27 = -1;
  if (this->capacity_ != 0) {
    i_00 = 0;
    do {
      if (this->ctrl_[i_00] == -2) {
        auVar8._8_8_ = 0;
        auVar8._0_8_ = this->slots_[i_00].value.first;
        uVar29 = SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar8,8) +
                 SUB168(ZEXT816(0xde5fb9d2630458e9) * auVar8,0);
        FVar31 = find_first_non_full(this,uVar29);
        i = FVar31.offset;
        uVar4 = this->capacity_;
        if ((uVar4 + 1 & uVar4) != 0) {
          __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                        "/workspace/llm4binary/github/license_c_cmakelists/siemens[P]drace/vendor/greg7mdp/parallel-hashmap/parallel_hashmap/phmap.h"
                        ,0x43,
                        "phmap::container_internal::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]"
                       );
        }
        uVar28 = uVar29 >> 7 & uVar4;
        bVar30 = (byte)uVar29;
        if (((i_00 - uVar28 ^ i - uVar28) & uVar4) < 0x10) {
          bVar30 = bVar30 & 0x7f;
        }
        else {
          if (this->ctrl_[i] == -2) {
            set_ctrl(this,i,bVar30 & 0x7f);
            psVar6 = this->slots_;
            new_slot = psVar6 + i_00;
            uVar7 = (new_slot->value).first;
            peVar25 = (new_slot->value).second.
                      super___shared_ptr<ThreadState,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            p_Var26 = (new_slot->value).second.
                      super___shared_ptr<ThreadState,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
            (new_slot->value).second.super___shared_ptr<ThreadState,_(__gnu_cxx::_Lock_policy)2>.
            _M_ptr = (element_type *)0x0;
            (new_slot->value).second.super___shared_ptr<ThreadState,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            map_slot_policy<unsigned_long,std::shared_ptr<ThreadState>>::
            transfer<std::allocator<std::pair<unsigned_long_const,std::shared_ptr<ThreadState>>>>
                      ((allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_> *)
                       &this->settings_,new_slot,psVar6 + i);
            psVar6 = this->slots_;
            psVar6[i].value.first = uVar7;
            puVar3 = (undefined8 *)((long)psVar6 + i * 0x18 + 8);
            *puVar3 = peVar25;
            puVar3[1] = p_Var26;
            i_00 = i_00 - 1;
            goto LAB_0010b2f8;
          }
          if (this->ctrl_[i] != -0x80) {
            __assert_fail("IsDeleted(ctrl_[new_i])",
                          "/workspace/llm4binary/github/license_c_cmakelists/siemens[P]drace/vendor/greg7mdp/parallel-hashmap/parallel_hashmap/phmap.h"
                          ,0x779,
                          "void phmap::container_internal::raw_hash_set<phmap::container_internal::FlatHashMapPolicy<unsigned long, std::shared_ptr<ThreadState>>, phmap::Hash<uint64_t>, phmap::EqualTo<unsigned long>, std::allocator<std::pair<const unsigned long, std::shared_ptr<ThreadState>>>>::drop_deletes_without_resize() [Policy = phmap::container_internal::FlatHashMapPolicy<unsigned long, std::shared_ptr<ThreadState>>, Hash = phmap::Hash<uint64_t>, Eq = phmap::EqualTo<unsigned long>, Alloc = std::allocator<std::pair<const unsigned long, std::shared_ptr<ThreadState>>>]"
                         );
          }
          set_ctrl(this,i,bVar30 & 0x7f);
          map_slot_policy<unsigned_long,std::shared_ptr<ThreadState>>::
          transfer<std::allocator<std::pair<unsigned_long_const,std::shared_ptr<ThreadState>>>>
                    ((allocator<std::pair<const_unsigned_long,_std::shared_ptr<ThreadState>_>_> *)
                     &this->settings_,this->slots_ + i,this->slots_ + i_00);
          bVar30 = 0x80;
        }
        set_ctrl(this,i_00,bVar30);
      }
LAB_0010b2f8:
      i_00 = i_00 + 1;
    } while (i_00 != this->capacity_);
  }
  reset_growth_left(this);
  return;
}

Assistant:

void drop_deletes_without_resize() PHMAP_ATTRIBUTE_NOINLINE {
        assert(IsValidCapacity(capacity_));
        assert(!is_small());
        // Algorithm:
        // - mark all DELETED slots as EMPTY
        // - mark all FULL slots as DELETED
        // - for each slot marked as DELETED
        //     hash = Hash(element)
        //     target = find_first_non_full(hash)
        //     if target is in the same group
        //       mark slot as FULL
        //     else if target is EMPTY
        //       transfer element to target
        //       mark slot as EMPTY
        //       mark target as FULL
        //     else if target is DELETED
        //       swap current element with target element
        //       mark target as FULL
        //       repeat procedure for current slot with moved from element (target)
        ConvertDeletedToEmptyAndFullToDeleted(ctrl_, capacity_);
        typename std::aligned_storage<sizeof(slot_type), alignof(slot_type)>::type
            raw;
        slot_type* slot = reinterpret_cast<slot_type*>(&raw);
        for (size_t i = 0; i != capacity_; ++i) {
            if (!IsDeleted(ctrl_[i])) continue;
            size_t hash = PolicyTraits::apply(HashElement{hash_ref()},
                                              PolicyTraits::element(slots_ + i));
            auto target = find_first_non_full(hash);
            size_t new_i = target.offset;

            // Verify if the old and new i fall within the same group wrt the hash.
            // If they do, we don't need to move the object as it falls already in the
            // best probe we can.
            const auto probe_index = [&](size_t pos) {
                return ((pos - probe(hash).offset()) & capacity_) / Group::kWidth;
            };

            // Element doesn't move.
            if (PHMAP_PREDICT_TRUE(probe_index(new_i) == probe_index(i))) {
                set_ctrl(i, H2(hash));
                continue;
            }
            if (IsEmpty(ctrl_[new_i])) {
                // Transfer element to the empty spot.
                // set_ctrl poisons/unpoisons the slots so we have to call it at the
                // right time.
                set_ctrl(new_i, H2(hash));
                PolicyTraits::transfer(&alloc_ref(), slots_ + new_i, slots_ + i);
                set_ctrl(i, kEmpty);
            } else {
                assert(IsDeleted(ctrl_[new_i]));
                set_ctrl(new_i, H2(hash));
                // Until we are done rehashing, DELETED marks previously FULL slots.
                // Swap i and new_i elements.
                PolicyTraits::transfer(&alloc_ref(), slot, slots_ + i);
                PolicyTraits::transfer(&alloc_ref(), slots_ + i, slots_ + new_i);
                PolicyTraits::transfer(&alloc_ref(), slots_ + new_i, slot);
                --i;  // repeat
            }
        }
        reset_growth_left();
    }